

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::FunctionPrototypeSyntax::setChild
          (FunctionPrototypeSyntax *this,size_t index,TokenOrSyntax child)

{
  long in_RSI;
  
  (*(code *)(&DAT_00c76634 + *(int *)(&DAT_00c76634 + in_RSI * 4)))();
  return;
}

Assistant:

void FunctionPrototypeSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: keyword = child.token(); return;
        case 1: specifiers = child.node()->as<SyntaxList<ClassSpecifierSyntax>>(); return;
        case 2: lifetime = child.token(); return;
        case 3: returnType = child.node() ? &child.node()->as<DataTypeSyntax>() : nullptr; return;
        case 4: name = child.node() ? &child.node()->as<NameSyntax>() : nullptr; return;
        case 5: portList = child.node() ? &child.node()->as<FunctionPortListSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}